

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O0

void advance(FM_OPL *OPL,int loch,int hich)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int lfo_fn_table_index_offset;
  uint fnum_lfo;
  uint block_fnum;
  UINT8 block;
  int i;
  OPL_SLOT *op;
  OPL_CH *CH;
  int hich_local;
  int loch_local;
  FM_OPL *OPL_local;
  
  OPL->eg_timer = OPL->eg_timer_add + OPL->eg_timer;
  while (OPL->eg_timer_overflow <= OPL->eg_timer) {
    OPL->eg_timer = OPL->eg_timer - OPL->eg_timer_overflow;
    OPL->eg_cnt = OPL->eg_cnt + 1;
    for (block_fnum = loch << 1; (int)block_fnum <= hich * 2 + 1; block_fnum = block_fnum + 1) {
      iVar2 = (int)block_fnum / 2;
      uVar3 = (ulong)((block_fnum & 1) * 0x60);
      switch(*(undefined1 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 10)) {
      case 1:
        if (((OPL->eg_cnt &
             (1 << (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x20) & 0x1f)) - 1U)
             == 0) &&
           (*(uint *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) =
                 (uint)""[(uint)*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x21) +
                          (OPL->eg_cnt >>
                           (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x20) & 0x1f)
                          & 7)] + *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14),
           0x1fe < *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14))) {
          *(undefined4 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) = 0x1ff;
          *(undefined1 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 10) = 0;
        }
        break;
      case 2:
        if (((*(char *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 9) == '\0') &&
            ((OPL->eg_cnt &
             (1 << (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x20) & 0x1f)) - 1U)
             == 0)) &&
           (*(uint *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) =
                 (uint)""[(uint)*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x21) +
                          (OPL->eg_cnt >>
                           (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x20) & 0x1f)
                          & 7)] + *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14),
           0x1fe < *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14))) {
          *(undefined4 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) = 0x1ff;
        }
        break;
      case 3:
        if (((OPL->eg_cnt &
             (1 << (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x1e) & 0x1f)) - 1U)
             == 0) &&
           (*(uint *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) =
                 (uint)""[(uint)*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x1f) +
                          (OPL->eg_cnt >>
                           (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x1e) & 0x1f)
                          & 7)] + *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14),
           *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x18) <=
           *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14))) {
          *(undefined1 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 10) = 2;
        }
        break;
      case 4:
        if (((OPL->eg_cnt &
             (1 << (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x1c) & 0x1f)) - 1U)
             == 0) &&
           (*(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) =
                 ((int)((*(uint *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) ^
                        0xffffffff) *
                       (uint)""[(uint)*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out +
                                               uVar3 + 0x1d) +
                                (OPL->eg_cnt >>
                                 (*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x1c) &
                                 0x1f) & 7)]) >> 3) +
                 *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14),
           *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) < 1)) {
          *(undefined4 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x14) = 0;
          *(undefined1 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 10) = 3;
        }
      }
      if (*(char *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + uVar3 + 0x2c) == '\0') {
        *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x18)) =
             *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x14)) +
             *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x18));
      }
      else {
        uVar1 = OPL->P_CH[iVar2].block_fnum;
        if (""[LFO_PM + ((uVar1 & 0x380) >> 7) * 0x10] == 0) {
          *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x18)) =
               *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x14)) +
               *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x18));
        }
        else {
          uVar1 = (int)""[LFO_PM + ((uVar1 & 0x380) >> 7) * 0x10] + uVar1;
          *(UINT32 *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x18)) =
               (OPL->fn_tab[uVar1 & 0x3ff] >> (7U - (char)((uVar1 & 0x1c00) >> 10) & 0x1f)) *
               (uint)*(byte *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x19)) +
               *(int *)((long)OPL->P_CH[iVar2].SLOT[0].op1_out + (uVar3 - 0x18));
        }
      }
    }
  }
  return;
}

Assistant:

INLINE void advance(FM_OPL *OPL, int loch, int hich)
{
	OPL_CH *CH;
	OPL_SLOT *op;
	int i;

	OPL->eg_timer += OPL->eg_timer_add;
	loch *= 2;
	hich *= 2;

	while (OPL->eg_timer >= OPL->eg_timer_overflow)
	{
		OPL->eg_timer -= OPL->eg_timer_overflow;

		OPL->eg_cnt++;

		for (i = loch; i <= hich + 1; i++)
		{
			CH  = &OPL->P_CH[i/2];
			op  = &CH->SLOT[i&1];

			/* Envelope Generator */
			switch(op->state)
			{
			case EG_ATT:		/* attack phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_ar)-1) ) )
				{
					op->volume += (~op->volume *
	                        		           (eg_inc[op->eg_sel_ar + ((OPL->eg_cnt>>op->eg_sh_ar)&7)])
        			                          ) >>3;

					if (op->volume <= MIN_ATT_INDEX)
					{
						op->volume = MIN_ATT_INDEX;
						op->state = EG_DEC;
					}

				}
			break;

			case EG_DEC:	/* decay phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_dr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_dr + ((OPL->eg_cnt>>op->eg_sh_dr)&7)];

					if ( op->volume >= (INT32)op->sl )
						op->state = EG_SUS;

				}
			break;

			case EG_SUS:	/* sustain phase */

				/* this is important behaviour:
				one can change percusive/non-percussive modes on the fly and
				the chip will remain in sustain phase - verified on real YM3812 */

				if(op->eg_type)		/* non-percussive mode */
				{
									/* do nothing */
				}
				else				/* percussive mode */
				{
					/* during sustain phase chip adds Release Rate (in percussive mode) */
					if ( !(OPL->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
					{
						op->volume += eg_inc[op->eg_sel_rr + ((OPL->eg_cnt>>op->eg_sh_rr)&7)];

						if ( op->volume >= MAX_ATT_INDEX )
							op->volume = MAX_ATT_INDEX;
					}
					/* else do nothing in sustain phase */
				}
			break;

			case EG_REL:	/* release phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_rr + ((OPL->eg_cnt>>op->eg_sh_rr)&7)];

					if ( op->volume >= MAX_ATT_INDEX )
					{
						op->volume = MAX_ATT_INDEX;
						op->state = EG_OFF;
					}

				}
			break;

			default:
			break;
			}

			/* Phase Generator */
			if(op->vib)
			{
				UINT8 block;
				unsigned int block_fnum = CH->block_fnum;

				unsigned int fnum_lfo   = (block_fnum&0x0380) >> 7;

				signed int lfo_fn_table_index_offset = lfo_pm_table[LFO_PM + 16*fnum_lfo ];

				if (lfo_fn_table_index_offset)	/* LFO phase modulation active */
				{
					block_fnum += lfo_fn_table_index_offset;
					block = (block_fnum&0x1c00) >> 10;
					op->Cnt += (OPL->fn_tab[block_fnum&0x03ff] >> (7-block)) * op->mul;
				}
				else	/* LFO phase modulation  = zero */
				{
					op->Cnt += op->Incr;
				}
			}
			else	/* LFO phase modulation disabled for this operator */
			{
				op->Cnt += op->Incr;
			}
		}
	}
}